

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::getBufferVariableCount
          (AtomicCounterCase *this,int binding)

{
  bool bVar1;
  DataType dataType;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar2;
  const_reference ppSVar3;
  DefaultBlock *pDVar4;
  size_type sVar5;
  reference pvVar6;
  int local_1c;
  int local_18;
  int ndx;
  int numVars;
  int binding_local;
  AtomicCounterCase *this_local;
  
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    ppSVar3 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar2,0);
    pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
    sVar5 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                      (&pDVar4->variables);
    if ((int)sVar5 <= local_1c) break;
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    ppSVar3 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar2,0);
    pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
    pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
             operator[](&pDVar4->variables,(long)local_1c);
    bVar1 = glu::VarType::isBasicType(&pvVar6->varType);
    if (bVar1) {
      pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
      ppSVar3 = std::
                vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ::operator[](pvVar2,0);
      pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
      pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
               operator[](&pDVar4->variables,(long)local_1c);
      dataType = glu::VarType::getBasicType(&pvVar6->varType);
      bVar1 = glu::isDataTypeAtomicCounter(dataType);
      if (bVar1) {
        pvVar2 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
        ppSVar3 = std::
                  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                  ::operator[](pvVar2,0);
        pDVar4 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar3);
        pvVar6 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                 operator[](&pDVar4->variables,(long)local_1c);
        if ((pvVar6->layout).binding == binding) {
          local_18 = local_18 + 1;
        }
      }
    }
    local_1c = local_1c + 1;
  }
  return local_18;
}

Assistant:

int AtomicCounterCase::getBufferVariableCount (int binding) const
{
	int numVars = 0;

	for (int ndx = 0; ndx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++ndx)
	{
		if (m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.isBasicType() &&
			glu::isDataTypeAtomicCounter(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.getBasicType()) &&
			m_program->getShaders()[0]->getDefaultBlock().variables[ndx].layout.binding == binding)
			++numVars;
	}

	return numVars;
}